

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::BufferCheck
          (DrawIndirectBase *this,CDataArray *dataRef,uint widthRef,uint heightRef,void *bufTest,
          uint widthTest,uint heightTest,uint offsetYRef,uint offsetYTest)

{
  long lVar1;
  undefined4 in_register_0000000c;
  ulong __n;
  uint in_stack_ffffffffffffffa8;
  value_type_conflict4 local_4c;
  CDataArray dataTest;
  
  __n = (ulong)(widthTest * (int)bufTest);
  local_4c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dataTest,__n,&local_4c,(allocator_type *)&stack0xffffffffffffffab);
  memcpy(dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,(void *)CONCAT44(in_register_0000000c,heightRef),__n << 2)
  ;
  lVar1 = DataCompare<unsigned_int>
                    (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((ulong)dataRef & 0xffffffff),widthRef,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((ulong)bufTest & 0xffffffff),widthTest,heightTest,0,in_stack_ffffffffffffffa8)
  ;
  if (dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return lVar1;
}

Assistant:

long BufferCheck(const CDataArray& dataRef, unsigned int widthRef, unsigned int heightRef, const void* bufTest,
					 unsigned int widthTest, unsigned int heightTest, unsigned int offsetYRef = 0,
					 unsigned int offsetYTest = 0)
	{
		if (bufTest == 0)
		{
			throw std::runtime_error("Invalid test buffer!");
		}

		CDataArray dataTest(widthTest * heightTest, 0);
		memcpy(&dataTest[0], bufTest, widthTest * heightTest * sizeof(unsigned int));

		return DataCompare(dataRef, widthRef, heightRef, dataTest, widthTest, heightTest, offsetYRef, offsetYTest);
	}